

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall UI::renderButton(UI *this,char *label,int width,bool active)

{
  bool bVar1;
  undefined1 in_CL;
  int in_EDX;
  undefined8 in_RSI;
  ImVec2 *in_RDI;
  ImVec2 p0;
  bool result;
  int npop;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar2;
  byte bVar3;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar4;
  
  uVar4 = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  uVar2 = (uint)in_stack_ffffffffffffffe0;
  ImGui::PushID((char *)(ulong)uVar2);
  bVar3 = (byte)(uVar2 >> 0x18);
  ImGui::GetCursorScreenPos();
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(float)in_EDX,1.0);
  bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI
                       );
  if (bVar1) {
    bVar3 = 1;
  }
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffffd0);
  if ((bVar1) || ((uVar4 & 0x1000000) != 0)) {
    ImGui::PushStyleColor((ImGuiCol)((ulong)in_RSI >> 0x20),(ImVec4 *)CONCAT44(in_EDX,uVar4));
  }
  ImGui::SetCursorScreenPos((ImVec2 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
  ;
  ImGui::Text("%s",in_RSI);
  ImGui::PopStyleColor((int)in_stack_ffffffffffffffd4);
  ImGui::PopID();
  return (bool)(bVar3 & 1);
}

Assistant:

bool UI::renderButton(const char * label, int width, bool active) {
    int npop = 0;
    bool result = false;

    ImGui::PushID(label);
    const auto p0 = ImGui::GetCursorScreenPos();
    if (ImGui::Button("##but", ImVec2(width, 1))) {
        result = true;
    }
    if (ImGui::IsItemHovered() || active) {
        ImGui::PushStyleColor(ImGuiCol_Text, colors.buttonActiveFG);
        ++npop;
    }
    ImGui::SetCursorScreenPos(p0);
    ImGui::Text("%s", label);
    ImGui::PopStyleColor(npop);
    ImGui::PopID();

    return result;
}